

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O2

void h265_read_sps_rbsp(h265_stream_t *h,bs_t *b)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  h265_sps_t *sps;
  videoinfo_t *pvVar5;
  uint32_t uVar6;
  uint32_t max_sub_layers_minus1;
  uint32_t uVar7;
  uint32_t uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int i;
  ulong uVar13;
  long lVar14;
  long lVar15;
  profile_tier_level_t local_2c0;
  
  uVar6 = bs_read_u(b,4);
  max_sub_layers_minus1 = bs_read_u(b,3);
  uVar7 = bs_read_u1(b);
  memset(&local_2c0,0,0x290);
  h265_read_ptl(&local_2c0,b,1,max_sub_layers_minus1);
  uVar8 = bs_read_ue(b);
  sps = h->sps_table[(int)uVar8];
  h->sps = sps;
  memset(sps,0,0x1ef8);
  sps->sps_video_parameter_set_id = (uint8_t)uVar6;
  sps->sps_max_sub_layers_minus1 = (uint8_t)max_sub_layers_minus1;
  sps->sps_temporal_id_nesting_flag = (uint8_t)uVar7;
  memcpy(&sps->ptl,&local_2c0,0x290);
  sps->sps_seq_parameter_set_id = uVar8;
  uVar6 = bs_read_ue(b);
  sps->chroma_format_idc = uVar6;
  h->info->chroma_format_idc = uVar6;
  if (uVar6 == 3) {
    uVar6 = bs_read_u1(b);
    sps->separate_colour_plane_flag = (uint8_t)uVar6;
  }
  uVar6 = bs_read_ue(b);
  sps->pic_width_in_luma_samples = uVar6;
  uVar6 = bs_read_ue(b);
  sps->pic_height_in_luma_samples = uVar6;
  pvVar5 = h->info;
  pvVar5->width = sps->pic_width_in_luma_samples;
  pvVar5->height = uVar6;
  uVar6 = bs_read_u1(b);
  sps->conformance_window_flag = uVar6;
  if (uVar6 != 0) {
    uVar6 = bs_read_ue(b);
    sps->conf_win_left_offset = uVar6;
    uVar6 = bs_read_ue(b);
    sps->conf_win_right_offset = uVar6;
    uVar6 = bs_read_ue(b);
    sps->conf_win_top_offset = uVar6;
    uVar6 = bs_read_ue(b);
    sps->conf_win_bottom_offset = uVar6;
    iVar10 = sps->conf_win_left_offset;
    pvVar5 = h->info;
    pvVar5->crop_left = iVar10;
    iVar2 = sps->conf_win_right_offset;
    pvVar5->crop_right = iVar2;
    iVar3 = sps->conf_win_top_offset;
    pvVar5->crop_top = iVar3;
    pvVar5->crop_bottom = uVar6;
    if (sps->chroma_format_idc - 1U < 2) {
      iVar12 = -1 - (uint)(sps->separate_colour_plane_flag == '\0');
      iVar11 = -1;
      if (sps->chroma_format_idc == 1) {
        iVar11 = iVar12;
      }
    }
    else {
      iVar12 = -1;
      iVar11 = iVar12;
    }
    pvVar5->width = pvVar5->width + (iVar2 + iVar10) * iVar12;
    pvVar5->height = pvVar5->height + (iVar3 + uVar6) * iVar11;
  }
  uVar6 = bs_read_ue(b);
  sps->bit_depth_luma_minus8 = uVar6;
  uVar6 = bs_read_ue(b);
  sps->bit_depth_chroma_minus8 = uVar6;
  pvVar5 = h->info;
  pvVar5->bit_depth_luma = sps->bit_depth_luma_minus8 + 8;
  pvVar5->bit_depth_chroma = uVar6 + 8;
  uVar6 = bs_read_ue(b);
  sps->log2_max_pic_order_cnt_lsb_minus4 = uVar6;
  uVar6 = bs_read_u1(b);
  sps->sps_sub_layer_ordering_info_present_flag = (uint8_t)uVar6;
  if (uVar6 == 0) {
    uVar13 = (ulong)sps->sps_max_sub_layers_minus1;
  }
  else {
    uVar13 = 0;
  }
  for (; bVar1 = sps->sps_max_sub_layers_minus1, uVar6 = bs_read_ue(b), uVar13 <= bVar1;
      uVar13 = uVar13 + 1) {
    sps->sps_max_dec_pic_buffering_minus1[uVar13] = uVar6;
    uVar6 = bs_read_ue(b);
    sps->sps_max_num_reorder_pics[uVar13] = uVar6;
    uVar6 = bs_read_ue(b);
    sps->sps_max_latency_increase_plus1[uVar13] = uVar6;
  }
  sps->log2_min_luma_coding_block_size_minus3 = uVar6;
  uVar6 = bs_read_ue(b);
  sps->log2_diff_max_min_luma_coding_block_size = uVar6;
  uVar6 = bs_read_ue(b);
  sps->log2_min_luma_transform_block_size_minus2 = uVar6;
  uVar6 = bs_read_ue(b);
  sps->log2_diff_max_min_luma_transform_block_size = uVar6;
  uVar6 = bs_read_ue(b);
  sps->max_transform_hierarchy_depth_inter = uVar6;
  uVar6 = bs_read_ue(b);
  sps->max_transform_hierarchy_depth_intra = uVar6;
  uVar6 = bs_read_u1(b);
  sps->scaling_list_enabled_flag = (uint8_t)uVar6;
  if (uVar6 != 0) {
    uVar6 = bs_read_u1(b);
    sps->sps_scaling_list_data_present_flag = uVar6;
    if (uVar6 != 0) {
      h265_read_scaling_list(&sps->scaling_list_data,b);
    }
  }
  uVar6 = bs_read_u1(b);
  sps->amp_enabled_flag = (uint8_t)uVar6;
  uVar6 = bs_read_u1(b);
  sps->sample_adaptive_offset_enabled_flag = (uint8_t)uVar6;
  uVar6 = bs_read_u1(b);
  sps->pcm_enabled_flag = (uint8_t)uVar6;
  if (uVar6 != 0) {
    uVar6 = bs_read_u(b,4);
    sps->pcm_sample_bit_depth_luma_minus1 = (uint8_t)uVar6;
    uVar6 = bs_read_u(b,4);
    sps->pcm_sample_bit_depth_chroma_minus1 = (uint8_t)uVar6;
    uVar6 = bs_read_ue(b);
    sps->log2_min_pcm_luma_coding_block_size_minus3 = uVar6;
    uVar6 = bs_read_ue(b);
    sps->log2_diff_max_min_pcm_luma_coding_block_size = uVar6;
    uVar6 = bs_read_u1(b);
    sps->pcm_loop_filter_disabled_flag = (uint8_t)uVar6;
  }
  uVar6 = bs_read_ue(b);
  sps->num_short_term_ref_pic_sets = uVar6;
  std::vector<st_ref_pic_set_t,_std::allocator<st_ref_pic_set_t>_>::resize
            (&sps->st_ref_pic_set,(long)(int)uVar6);
  std::vector<referencePictureSets_t,_std::allocator<referencePictureSets_t>_>::resize
            (&sps->m_RPSList,(long)sps->num_short_term_ref_pic_sets);
  lVar15 = 0;
  lVar9 = 0;
  for (lVar14 = 0; lVar14 < sps->num_short_term_ref_pic_sets; lVar14 = lVar14 + 1) {
    h265_read_short_term_ref_pic_set
              (b,sps,(st_ref_pic_set_t *)(*(long *)&sps->st_ref_pic_set + lVar9),
               (referencePictureSets_t *)(*(long *)&sps->m_RPSList + lVar15),(int)lVar14);
    lVar9 = lVar9 + 0xa8;
    lVar15 = lVar15 + 0x224;
  }
  uVar6 = bs_read_u1(b);
  sps->long_term_ref_pics_present_flag = (uint8_t)uVar6;
  if (uVar6 != 0) {
    uVar6 = bs_read_ue(b);
    sps->num_long_term_ref_pics_sps = uVar6;
    std::vector<int,_std::allocator<int>_>::resize(&sps->lt_ref_pic_poc_lsb_sps,(long)(int)uVar6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&sps->used_by_curr_pic_lt_sps_flag,(long)sps->num_long_term_ref_pics_sps);
    for (lVar9 = 0; lVar9 < sps->num_long_term_ref_pics_sps; lVar9 = lVar9 + 1) {
      iVar10 = sps->log2_max_pic_order_cnt_lsb_minus4 + 4;
      sps->lt_ref_pic_poc_lsb_sps_bytes = iVar10;
      uVar6 = bs_read_u(b,iVar10);
      (sps->lt_ref_pic_poc_lsb_sps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9] = uVar6;
      uVar6 = bs_read_u1(b);
      (sps->used_by_curr_pic_lt_sps_flag).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9] = (uchar)uVar6;
    }
  }
  uVar6 = bs_read_u1(b);
  sps->sps_temporal_mvp_enabled_flag = (uint8_t)uVar6;
  uVar6 = bs_read_u1(b);
  sps->strong_intra_smoothing_enabled_flag = (uint8_t)uVar6;
  uVar6 = bs_read_u1(b);
  sps->vui_parameters_present_flag = (uint8_t)uVar6;
  if (uVar6 != 0) {
    h265_read_vui_parameters(&sps->vui,b,(uint)sps->sps_max_sub_layers_minus1);
    uVar4 = (sps->vui).vui_num_units_in_tick;
    if (uVar4 != 0) {
      h->info->max_framerate = (float)(sps->vui).vui_time_scale / (float)uVar4;
    }
  }
  uVar6 = bs_read_u1(b);
  sps->sps_extension_present_flag = (uint8_t)uVar6;
  if (uVar6 != 0) {
    uVar6 = bs_read_u1(b);
    sps->sps_range_extension_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    sps->sps_multilayer_extension_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    sps->sps_3d_extension_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u(b,5);
    sps->sps_extension_5bits = (uint8_t)uVar6;
  }
  if (sps->sps_range_extension_flag != '\0') {
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).transform_skip_rotation_enabled_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).transform_skip_context_enabled_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).implicit_rdpcm_enabled_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).explicit_rdpcm_enabled_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).extended_precision_processing_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).intra_smoothing_disabled_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).high_precision_offsets_enabled_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).persistent_rice_adaptation_enabled_flag = (uint8_t)uVar6;
    uVar6 = bs_read_u1(b);
    (sps->sps_range_extension).cabac_bypass_alignment_enabled_flag = (uint8_t)uVar6;
  }
  if (sps->sps_multilayer_extension_flag != '\0') {
    uVar6 = bs_read_u1(b);
    sps->inter_view_mv_vert_constraint_flag = (uint8_t)uVar6;
  }
  if (sps->sps_extension_5bits != '\0') {
    while (b->p < b->end) {
      bs_read_u1(b);
    }
  }
  h265_read_rbsp_trailing_bits(b);
  profile_tier_level_t::~profile_tier_level_t(&local_2c0);
  return;
}

Assistant:

void  h265_read_sps_rbsp(h265_stream_t* h, bs_t* b)
{
    // NOTE 不能直接赋值给sps，因为还未知是哪一个sps。

    int sps_video_parameter_set_id = 0;
    int sps_max_sub_layers_minus1 = 0;
    int sps_temporal_id_nesting_flag = 0;
    int sps_seq_parameter_set_id = 0;
    profile_tier_level_t profile_tier_level;

    sps_video_parameter_set_id = bs_read_u(b, 4);
    sps_max_sub_layers_minus1 = bs_read_u(b, 3);
    sps_temporal_id_nesting_flag = bs_read_u1(b);

    // profile tier level...
    memset(&profile_tier_level, '\0', sizeof(profile_tier_level_t));

    h265_read_ptl(&profile_tier_level, b, 1, sps_max_sub_layers_minus1);

    sps_seq_parameter_set_id = bs_read_ue(b);
    // 选择正确的sps表
    h->sps = h->sps_table[sps_seq_parameter_set_id];
    h265_sps_t* sps = h->sps;
    memset(sps, 0, sizeof(h265_sps_t));

    sps->sps_video_parameter_set_id   = sps_video_parameter_set_id;
    sps->sps_max_sub_layers_minus1    = sps_max_sub_layers_minus1;
    sps->sps_temporal_id_nesting_flag = sps_temporal_id_nesting_flag;

    memcpy(&(sps->ptl), &profile_tier_level, sizeof(profile_tier_level_t)); // ptl

    sps->sps_seq_parameter_set_id     = sps_seq_parameter_set_id;
    sps->chroma_format_idc     = bs_read_ue(b);
    h->info->chroma_format_idc = sps->chroma_format_idc;
    if (sps->chroma_format_idc == 3)
    {
        sps->separate_colour_plane_flag = bs_read_u1(b);
    }
    sps->pic_width_in_luma_samples  = bs_read_ue(b);
    sps->pic_height_in_luma_samples = bs_read_ue(b);

    h->info->width  = sps->pic_width_in_luma_samples;
    h->info->height = sps->pic_height_in_luma_samples;

    sps->conformance_window_flag    = bs_read_u1(b);
    if (sps->conformance_window_flag)
    {
        sps->conf_win_left_offset   = bs_read_ue(b);
        sps->conf_win_right_offset  = bs_read_ue(b);
        sps->conf_win_top_offset    = bs_read_ue(b);
        sps->conf_win_bottom_offset = bs_read_ue(b);

        // calc width & height again...
        h->info->crop_left = sps->conf_win_left_offset;
        h->info->crop_right = sps->conf_win_right_offset;
        h->info->crop_top = sps->conf_win_top_offset;
        h->info->crop_bottom = sps->conf_win_bottom_offset;

        // 根据Table6-1及7.4.3.2.1重新计算宽、高
        // 注意：手册里加1，实际上不用
        // 参考：https://github.com/mbunkus/mkvtoolnix/issues/1152
        int sub_width_c  = ((1 == sps->chroma_format_idc) || (2 == sps->chroma_format_idc)) && (0 == sps->separate_colour_plane_flag) ? 2 : 1;
        int sub_height_c =  (1 == sps->chroma_format_idc)                                  && (0 == sps->separate_colour_plane_flag) ? 2 : 1;
        h->info->width  -= (sub_width_c*sps->conf_win_right_offset + sub_width_c*sps->conf_win_left_offset);
        h->info->height -= (sub_height_c*sps->conf_win_bottom_offset + sub_height_c*sps->conf_win_top_offset);
    }

    sps->bit_depth_luma_minus8   = bs_read_ue(b);
    sps->bit_depth_chroma_minus8 = bs_read_ue(b);

    // bit depth
    h->info->bit_depth_luma = sps->bit_depth_luma_minus8 + 8;
    h->info->bit_depth_chroma = sps->bit_depth_chroma_minus8 + 8;

    sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b);

    sps->sps_sub_layer_ordering_info_present_flag = bs_read_u1(b);
    for (int i = (sps->sps_sub_layer_ordering_info_present_flag ? 0 : sps->sps_max_sub_layers_minus1);
         i <= sps->sps_max_sub_layers_minus1; i++ )
    {
        sps->sps_max_dec_pic_buffering_minus1[i] = bs_read_ue(b);
        sps->sps_max_num_reorder_pics[i]         = bs_read_ue(b);
        sps->sps_max_latency_increase_plus1[i]   = bs_read_ue(b);
    }

    sps->log2_min_luma_coding_block_size_minus3      = bs_read_ue(b);
    sps->log2_diff_max_min_luma_coding_block_size    = bs_read_ue(b);
    sps->log2_min_luma_transform_block_size_minus2   = bs_read_ue(b);
    sps->log2_diff_max_min_luma_transform_block_size = bs_read_ue(b);
    sps->max_transform_hierarchy_depth_inter         = bs_read_ue(b);
    sps->max_transform_hierarchy_depth_intra         = bs_read_ue(b);

    sps->scaling_list_enabled_flag = bs_read_u1(b);
    if (sps->scaling_list_enabled_flag)
    {
        sps->sps_scaling_list_data_present_flag = bs_read_u1(b);
        if (sps->sps_scaling_list_data_present_flag)
        {
            // scaling_list_data()
            h265_read_scaling_list(&(sps->scaling_list_data), b);
        }
    }

    sps->amp_enabled_flag = bs_read_u1(b);
    sps->sample_adaptive_offset_enabled_flag = bs_read_u1(b);
    sps->pcm_enabled_flag = bs_read_u1(b);
    if (sps->pcm_enabled_flag)
    {
        sps->pcm_sample_bit_depth_luma_minus1   = bs_read_u(b, 4);
        sps->pcm_sample_bit_depth_chroma_minus1 = bs_read_u(b, 4);
        sps->log2_min_pcm_luma_coding_block_size_minus3   = bs_read_ue(b);
        sps->log2_diff_max_min_pcm_luma_coding_block_size = bs_read_ue(b);
        sps->pcm_loop_filter_disabled_flag      = bs_read_u1(b);
    }

    sps->num_short_term_ref_pic_sets = bs_read_ue(b);
    // 根据num_short_term_ref_pic_sets创建数组
    sps->st_ref_pic_set.resize(sps->num_short_term_ref_pic_sets);
    sps->m_RPSList.resize(sps->num_short_term_ref_pic_sets); // 确定一共有多少个RPS列表
    referencePictureSets_t* rps = NULL;
    st_ref_pic_set_t* st = NULL;
    for (int i = 0; i < sps->num_short_term_ref_pic_sets; i++)
    {
        st = &sps->st_ref_pic_set[i];
        rps = &sps->m_RPSList[i];
        h265_read_short_term_ref_pic_set(b, sps, st, rps, i);
    }

    sps->long_term_ref_pics_present_flag = bs_read_u1(b);
    if (sps->long_term_ref_pics_present_flag)
    {
        sps->num_long_term_ref_pics_sps = bs_read_ue(b);
        sps->lt_ref_pic_poc_lsb_sps.resize(sps->num_long_term_ref_pics_sps);
        sps->used_by_curr_pic_lt_sps_flag.resize(sps->num_long_term_ref_pics_sps);
        for (int i = 0; i < sps->num_long_term_ref_pics_sps; i++)
        {
            sps->lt_ref_pic_poc_lsb_sps_bytes = sps->log2_max_pic_order_cnt_lsb_minus4 + 4;
            sps->lt_ref_pic_poc_lsb_sps[i] = bs_read_u(b, sps->log2_max_pic_order_cnt_lsb_minus4 + 4); // u(v)
            sps->used_by_curr_pic_lt_sps_flag[i] = bs_read_u1(b);
        }
    }

    sps->sps_temporal_mvp_enabled_flag = bs_read_u1(b);
    sps->strong_intra_smoothing_enabled_flag = bs_read_u1(b);
    sps->vui_parameters_present_flag = bs_read_u1(b);
    if (sps->vui_parameters_present_flag)
    {
        h265_read_vui_parameters(&(sps->vui), b, sps->sps_max_sub_layers_minus1);
        // calc fps
        if (sps->vui.vui_num_units_in_tick != 0)
            h->info->max_framerate = (float)(sps->vui.vui_time_scale) / (float)(sps->vui.vui_num_units_in_tick);
    }

    sps->sps_extension_present_flag = bs_read_u1(b);
    if (sps->sps_extension_present_flag)
    {
        sps->sps_range_extension_flag      = bs_read_u1(b);
        sps->sps_multilayer_extension_flag = bs_read_u1(b);
        sps->sps_3d_extension_flag         = bs_read_u1(b);
        sps->sps_extension_5bits           = bs_read_u(b, 5);
    }

    if (sps->sps_range_extension_flag)
    {
        sps->sps_range_extension.transform_skip_rotation_enabled_flag    = bs_read_u1(b);
        sps->sps_range_extension.transform_skip_context_enabled_flag     = bs_read_u1(b);
        sps->sps_range_extension.implicit_rdpcm_enabled_flag             = bs_read_u1(b);
        sps->sps_range_extension.explicit_rdpcm_enabled_flag             = bs_read_u1(b);
        sps->sps_range_extension.extended_precision_processing_flag      = bs_read_u1(b);
        sps->sps_range_extension.intra_smoothing_disabled_flag           = bs_read_u1(b);
        sps->sps_range_extension.high_precision_offsets_enabled_flag     = bs_read_u1(b);
        sps->sps_range_extension.persistent_rice_adaptation_enabled_flag = bs_read_u1(b);
        sps->sps_range_extension.cabac_bypass_alignment_enabled_flag     = bs_read_u1(b);
    }
    if (sps->sps_multilayer_extension_flag)
    {
        // sps_multilayer_extension()
        sps->inter_view_mv_vert_constraint_flag = bs_read_u1(b);
    }
    if (sps->sps_3d_extension_flag)
    {
        // todo sps_3d_extension( )
    }
    if (sps->sps_extension_5bits)
    {
        while (h265_more_rbsp_trailing_data(b))
        {
            int sps_extension_data_flag = bs_read_u1(b);
        }
    }
    h265_read_rbsp_trailing_bits(b);
}